

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O2

bool __thiscall
cppjieba::DictTrie::MakeNodeInfo
          (DictTrie *this,DictUnit *node_info,string *word,double weight,string *tag)

{
  bool bVar1;
  ostream *poVar2;
  Logger local_1a0;
  
  bVar1 = DecodeRunesInString(word,&node_info->word);
  if (bVar1) {
    node_info->weight = weight;
    std::__cxx11::string::_M_assign((string *)&node_info->tag);
  }
  else {
    limonp::Logger::Logger
              (&local_1a0,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/DictTrie.hpp"
               ,0xc1);
    poVar2 = std::operator<<((ostream *)&local_1a0,"Decode ");
    poVar2 = std::operator<<(poVar2,(string *)word);
    std::operator<<(poVar2," failed.");
    limonp::Logger::~Logger(&local_1a0);
  }
  return bVar1;
}

Assistant:

bool MakeNodeInfo(DictUnit& node_info,
        const string& word, 
        double weight, 
        const string& tag) {
    if (!DecodeRunesInString(word, node_info.word)) {
      XLOG(ERROR) << "Decode " << word << " failed.";
      return false;
    }
    node_info.weight = weight;
    node_info.tag = tag;
    return true;
  }